

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonOneofFieldVariables
          (FieldGeneratorBase *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  bool bVar1;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  AlphaNum *this_00;
  AlphaNum local_190;
  string local_160;
  string local_140;
  AlphaNum local_120;
  AlphaNum local_f0;
  undefined1 local_c0 [64];
  AlphaNum local_80;
  AlphaNum local_50;
  
  oneof_name_abi_cxx11_((string *)&local_190,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[11]> *)0x36e685);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = SupportsPresenceApi(this->descriptor_);
  if (bVar1) {
    local_190.piece_ = absl::lts_20240722::NullSafeStringView("Has");
    property_name_abi_cxx11_((string *)&local_120,this);
    local_80.piece_._M_str = (char *)local_120.piece_._M_len;
    local_80.piece_._M_len = (size_t)local_120.piece_._M_str;
    absl::lts_20240722::StrCat_abi_cxx11_(&local_f0,&local_190);
    pbVar2 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)variables,(key_arg<char[19]> *)0x379770);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_00 = &local_120;
  }
  else {
    oneof_name_abi_cxx11_((string *)local_c0,this);
    local_190.piece_._M_str = (char *)local_c0._0_8_;
    local_190.piece_._M_len = local_c0._8_8_;
    local_80.piece_ = absl::lts_20240722::NullSafeStringView("Case_ == ");
    oneof_property_name_abi_cxx11_(&local_140,this);
    local_f0.piece_._M_len = local_140._M_string_length;
    local_f0.piece_._M_str = local_140._M_dataplus._M_p;
    local_120.piece_ = absl::lts_20240722::NullSafeStringView("OneofCase.");
    oneof_case_name_abi_cxx11_(&local_160,this);
    local_50.piece_._M_len = local_160._M_string_length;
    local_50.piece_._M_str = local_160._M_dataplus._M_p;
    absl::lts_20240722::StrCat<>
              ((string *)(local_c0 + 0x20),&local_190,&local_80,&local_f0,&local_120,&local_50);
    pbVar2 = absl::lts_20240722::container_internal::
             raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[19],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)variables,(key_arg<char[19]> *)0x379770);
    std::__cxx11::string::operator=((string *)pbVar2,(string *)(local_c0 + 0x20));
    std::__cxx11::string::~string((string *)(local_c0 + 0x20));
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
    this_00 = (AlphaNum *)local_c0;
  }
  std::__cxx11::string::~string((string *)this_00);
  oneof_case_name_abi_cxx11_((string *)&local_190,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[16],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[16]> *)"oneof_case_name");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  oneof_property_name_abi_cxx11_((string *)&local_190,this);
  pbVar2 = absl::lts_20240722::container_internal::
           raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[20],absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)variables,(key_arg<char[20]> *)"oneof_property_name");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonOneofFieldVariables(
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = oneof_name();
  if (SupportsPresenceApi(descriptor_)) {
    (*variables)["has_property_check"] = absl::StrCat("Has", property_name());
  } else {
    (*variables)["has_property_check"] =
        absl::StrCat(oneof_name(), "Case_ == ", oneof_property_name(),
                     "OneofCase.", oneof_case_name());
  }
  (*variables)["oneof_case_name"] = oneof_case_name();
  (*variables)["oneof_property_name"] = oneof_property_name();
}